

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O3

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  
  if (handle == &client || handle == &server) {
    if (flags != 0) goto LAB_0017c269;
    if (nread < 0) goto LAB_0017c26e;
    if (nread == 0) {
      if (addr == (sockaddr *)0x0) {
        return;
      }
      goto LAB_0017c282;
    }
    if (addr == (sockaddr *)0x0) goto LAB_0017c273;
    if (nread != 4) goto LAB_0017c278;
    if (*(int *)buf->base == 0x474e4f50) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close(handle,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_1();
LAB_0017c269:
    cl_recv_cb_cold_2();
LAB_0017c26e:
    cl_recv_cb_cold_7();
LAB_0017c273:
    cl_recv_cb_cold_5();
LAB_0017c278:
    cl_recv_cb_cold_3();
  }
  cl_recv_cb_cold_4();
LAB_0017c282:
  cl_recv_cb_cold_6();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,0);
  return;
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT(flags == 0);
  ASSERT(nread == UV_ENOBUFS);

  cl_recv_cb_called++;

  uv_close((uv_handle_t*) handle, close_cb);
}